

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidexample.cpp
# Opt level: O2

float getAlpha(float xmin,float ymin,float xmax,float ymax,float size)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float ymax_00;
  float fVar4;
  
  fVar1 = ymax * ymax + xmin * xmin;
  fVar2 = xmin * xmin + ymin * ymin;
  fVar4 = size * size;
  fVar3 = xmax * xmax + ymin * ymin;
  if (((fVar1 < fVar4) && (fVar2 < fVar4)) && (fVar3 < fVar4)) {
    return (ymax - ymin) * (xmax - xmin);
  }
  if ((((fVar1 < fVar4) || (fVar2 < fVar4)) || (fVar3 < fVar4)) &&
     ((0.001 <= xmax - xmin || (0.001 <= ymax - ymin)))) {
    fVar4 = (xmin + xmax) * 0.5;
    ymax_00 = (ymin + ymax) * 0.5;
    fVar1 = getAlpha(xmin,ymin,fVar4,ymax_00,size);
    fVar2 = getAlpha(fVar4,ymin,xmax,ymax_00,size);
    fVar3 = getAlpha(xmin,ymax_00,fVar4,ymax,size);
    fVar4 = getAlpha(fVar4,ymax_00,xmax,ymax,size);
    return fVar4 + fVar3 + fVar2 + fVar1;
  }
  return 0.0;
}

Assistant:

float
getAlpha (float xmin, float ymin, float xmax, float ymax, float size)
{
    bool in1 = xmin * xmin + ymin * ymin < size * size;
    bool in2 = xmax * xmax + ymin * ymin < size * size;
    bool in3 = xmin * xmin + ymax * ymax < size * size;
    bool in4 = xmin * xmin + ymax * ymax < size * size;

    if (in1 && in2 && in3 && in4) { return (xmax - xmin) * (ymax - ymin); }
    if (!in1 && !in2 && !in3 && !in4) { return 0.f; }
    if (xmax - xmin < 0.001 && ymax - ymin < 0.001) { return 0.f; }
    return getAlpha (xmin, ymin, (xmin + xmax) / 2, (ymin + ymax) / 2, size) +
           getAlpha ((xmin + xmax) / 2, ymin, xmax, (ymin + ymax) / 2, size) +
           getAlpha (xmin, (ymin + ymax) / 2, (xmin + xmax) / 2, ymax, size) +
           getAlpha ((xmin + xmax) / 2, (ymin + ymax) / 2, xmax, ymax, size);
}